

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O1

Block * __thiscall
CFG::Relooper::AddBlock(Relooper *this,Expression *CodeInit,Expression *SwitchConditionInit)

{
  int iVar1;
  _Head_base<0UL,_CFG::Block_*,_false> this_00;
  __uniq_ptr_impl<CFG::Block,_std::default_delete<CFG::Block>_> local_30;
  __single_object block;
  
  this_00._M_head_impl = (Block *)operator_new(0x170);
  Block::Block(this_00._M_head_impl,this,CodeInit,SwitchConditionInit);
  iVar1 = this->BlockIdCounter;
  this->BlockIdCounter = iVar1 + 1;
  (this_00._M_head_impl)->Id = iVar1;
  local_30._M_t.super__Tuple_impl<0UL,_CFG::Block_*,_std::default_delete<CFG::Block>_>.
  super__Head_base<0UL,_CFG::Block_*,_false>._M_head_impl =
       (tuple<CFG::Block_*,_std::default_delete<CFG::Block>_>)
       (tuple<CFG::Block_*,_std::default_delete<CFG::Block>_>)this_00._M_head_impl;
  std::
  deque<std::unique_ptr<CFG::Block,std::default_delete<CFG::Block>>,std::allocator<std::unique_ptr<CFG::Block,std::default_delete<CFG::Block>>>>
  ::emplace_back<std::unique_ptr<CFG::Block,std::default_delete<CFG::Block>>>
            ((deque<std::unique_ptr<CFG::Block,std::default_delete<CFG::Block>>,std::allocator<std::unique_ptr<CFG::Block,std::default_delete<CFG::Block>>>>
              *)&this->Blocks,(unique_ptr<CFG::Block,_std::default_delete<CFG::Block>_> *)&local_30)
  ;
  std::unique_ptr<CFG::Block,_std::default_delete<CFG::Block>_>::~unique_ptr
            ((unique_ptr<CFG::Block,_std::default_delete<CFG::Block>_> *)&local_30);
  return (_Head_base<0UL,_CFG::Block_*,_false>)this_00._M_head_impl;
}

Assistant:

Block* Relooper::AddBlock(wasm::Expression* CodeInit,
                          wasm::Expression* SwitchConditionInit) {

  auto block = std::make_unique<Block>(this, CodeInit, SwitchConditionInit);
  block->Id = BlockIdCounter++;
  auto* blockPtr = block.get();
  Blocks.push_back(std::move(block));
  return blockPtr;
}